

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O3

string_t duckdb::CastFromPointer::Operation<unsigned_long>(uintptr_t input,Vector *vector)

{
  anon_union_16_2_67f50693_for_value aVar1;
  basic_string_view<char> format_str;
  basic_format_args<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
  args;
  string s;
  string local_268;
  uintptr_t local_248 [2];
  undefined **local_238;
  undefined1 *local_230;
  long local_228;
  undefined8 local_220;
  undefined1 local_218 [504];
  
  local_228 = 0;
  local_238 = &PTR_grow_01967680;
  local_220 = 500;
  format_str.size_ = 6;
  format_str.data_ = "0x{:x}";
  args.field_1.values_ =
       (value<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
        *)local_248;
  args.types_ = 5;
  local_248[0] = input;
  local_230 = local_218;
  duckdb_fmt::v6::
  vformat_to<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>>,char,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
            ((range)&local_238,format_str,args,(locale_ref)0x0);
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,local_230,local_230 + local_228);
  local_238 = &PTR_grow_01967680;
  if (local_230 != local_218) {
    operator_delete(local_230);
  }
  aVar1.pointer = (anon_struct_16_3_d7536bce_for_pointer)StringVector::AddString(vector,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

string_t CastFromPointer::Operation(uintptr_t input, Vector &vector) {
	std::string s = duckdb_fmt::format("0x{:x}", input);
	return StringVector::AddString(vector, s);
}